

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O0

int onig_st_lookup_callout_name_table
              (hash_table_type table,OnigEncoding enc,int type,OnigUChar *str_key,OnigUChar *end_key
              ,hash_data_type *value)

{
  int iVar1;
  OnigEncoding local_58;
  st_callout_name_key key;
  hash_data_type *value_local;
  OnigUChar *end_key_local;
  OnigUChar *str_key_local;
  int type_local;
  OnigEncoding enc_local;
  hash_table_type table_local;
  
  local_58 = enc;
  key.enc._0_4_ = type;
  key._8_8_ = str_key;
  key.s = end_key;
  key.end = (OnigUChar *)value;
  iVar1 = onig_st_lookup((st_table *)table,(st_data_t)&local_58,value);
  return iVar1;
}

Assistant:

extern int
onig_st_lookup_callout_name_table(hash_table_type table,
                                  OnigEncoding enc,
                                  int type,
                                  const UChar* str_key,
                                  const UChar* end_key,
                                  hash_data_type *value)
{
  st_callout_name_key key;

  key.enc  = enc;
  key.type = type;
  key.s    = (UChar* )str_key;
  key.end  = (UChar* )end_key;

  return onig_st_lookup(table, (st_data_t )(&key), value);
}